

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O0

SIBEdge * GetEdge(SIBMesh *mesh,uint32_t posA,uint32_t posB)

{
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  undefined1 local_44 [8];
  SIBEdge edge;
  _Self local_30;
  iterator it;
  SIBPair pair;
  uint32_t posB_local;
  uint32_t posA_local;
  SIBMesh *mesh_local;
  
  pair.first = posB;
  pair.second = posA;
  if (posA < posB) {
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
              ((pair<unsigned_int,_unsigned_int> *)&it,&pair.second,&pair.first);
  }
  else {
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
              ((pair<unsigned_int,_unsigned_int> *)&it,&pair.first,&pair.second);
  }
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
       ::find(&mesh->edgeMap,(key_type *)&it);
  edge._4_8_ = std::
               map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
               ::end(&mesh->edgeMap);
  bVar1 = std::operator!=(&local_30,(_Self *)&edge.faceB);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>
             ::operator->(&local_30);
    mesh_local = (SIBMesh *)
                 std::vector<SIBEdge,_std::allocator<SIBEdge>_>::operator[]
                           (&mesh->edges,(ulong)ppVar2->second);
  }
  else {
    edge.faceA._0_1_ = 0;
    local_44._4_4_ = 0xffffffff;
    local_44._0_4_ = 0xffffffff;
    sVar3 = std::vector<SIBEdge,_std::allocator<SIBEdge>_>::size(&mesh->edges);
    pmVar4 = std::
             map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
             ::operator[](&mesh->edgeMap,(key_type *)&it);
    *pmVar4 = (mapped_type)sVar3;
    std::vector<SIBEdge,_std::allocator<SIBEdge>_>::push_back(&mesh->edges,(value_type *)local_44);
    mesh_local = (SIBMesh *)std::vector<SIBEdge,_std::allocator<SIBEdge>_>::back(&mesh->edges);
  }
  return (SIBEdge *)mesh_local;
}

Assistant:

static SIBEdge& GetEdge(SIBMesh* mesh, uint32_t posA, uint32_t posB) {
    SIBPair pair = (posA < posB) ? SIBPair(posA, posB) : SIBPair(posB, posA);
    std::map<SIBPair, uint32_t>::iterator it = mesh->edgeMap.find(pair);
    if (it != mesh->edgeMap.end())
        return mesh->edges[it->second];

    SIBEdge edge;
    edge.creased = false;
    edge.faceA = edge.faceB = 0xffffffff;
    mesh->edgeMap[pair] = static_cast<uint32_t>(mesh->edges.size());
    mesh->edges.push_back(edge);
    return mesh->edges.back();
}